

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alex_nodes.h
# Opt level: O3

double __thiscall
alex::
AlexDataNode<double,_double,_alex::AlexCompare,_std::allocator<std::pair<double,_double>_>,_true>::
compute_expected_cost
          (AlexDataNode<double,_double,_alex::AlexCompare,_std::allocator<std::pair<double,_double>_>,_true>
           *this,double frac_inserts)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  long lVar4;
  int iVar5;
  ulong uVar6;
  ulong uVar7;
  int iVar8;
  uint64_t uVar9;
  ulong uVar10;
  uint uVar11;
  double dVar12;
  double dVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined8 in_XMM3_Qb;
  uint local_64;
  long local_60;
  
  if (this->num_keys_ == 0) {
    dVar13 = 0.0;
  }
  else {
    uVar10 = 0;
    uVar6 = *this->bitmap_;
    if (uVar6 == 0) {
      uVar7 = 1;
      if (1 < this->bitmap_size_) {
        uVar7 = (ulong)(uint)this->bitmap_size_;
      }
      uVar10 = 0;
      do {
        if (uVar7 - 1 == uVar10) goto LAB_00111a86;
        uVar6 = this->bitmap_[uVar10 + 1];
        uVar10 = uVar10 + 1;
      } while (uVar6 == 0);
    }
    uVar1 = 0;
    for (uVar7 = uVar6; (uVar7 & 1) == 0; uVar7 = uVar7 >> 1 | 0x8000000000000000) {
      uVar1 = uVar1 + 1;
    }
    uVar1 = uVar1 | (int)uVar10 << 6;
    if (uVar1 == 0xffffffff) {
LAB_00111a86:
      this->expected_avg_exp_search_iterations_ = 0.0;
      auVar19 = ZEXT816(0) << 0x40;
    }
    else {
      uVar9 = uVar6 - 1 & uVar6;
      dVar13 = 0.0;
      iVar8 = 0;
      local_64 = 0;
      local_60 = 0;
      uVar11 = 0xffffffff;
      do {
        uVar2 = uVar1;
        auVar17._8_8_ = 0;
        auVar17._0_8_ = (this->super_AlexNode<double,_double>).model_.a_;
        auVar14._8_8_ = 0;
        auVar14._0_8_ = this->key_slots_[(int)uVar2];
        uVar1 = this->data_capacity_ - 1;
        auVar19._8_8_ = 0;
        auVar19._0_8_ = (this->super_AlexNode<double,_double>).model_.b_;
        auVar19 = vfmadd213sd_fma(auVar17,auVar14,auVar19);
        if ((int)auVar19._0_8_ <= (int)uVar1) {
          uVar1 = (int)auVar19._0_8_;
        }
        iVar3 = (~((int)uVar1 >> 0x1f) & uVar1) - uVar2;
        iVar5 = -iVar3;
        if (0 < iVar3) {
          iVar5 = iVar3;
        }
        dVar12 = log2((double)(iVar5 + 1));
        if ((int)(uVar11 + 1) < (int)uVar2) {
          lVar4 = (long)(int)((uVar11 + 1) - local_64);
          local_60 = local_60 + ((ulong)(lVar4 * lVar4) >> 2);
          local_64 = uVar2;
        }
        iVar8 = iVar8 + 1;
        dVar13 = dVar13 + dVar12;
        if (uVar9 == 0) {
          lVar4 = (long)(int)uVar10;
          do {
            lVar4 = lVar4 + 1;
            if (this->bitmap_size_ <= lVar4) goto LAB_00111a49;
            uVar9 = this->bitmap_[lVar4];
            uVar10 = (ulong)((int)uVar10 + 1);
          } while (uVar9 == 0);
        }
        uVar1 = 0;
        for (uVar6 = uVar9; (uVar6 & 1) == 0; uVar6 = uVar6 >> 1 | 0x8000000000000000) {
          uVar1 = uVar1 + 1;
        }
        uVar9 = uVar9 - 1 & uVar9;
        uVar1 = uVar1 | (int)uVar10 << 6;
        uVar11 = uVar2;
      } while (uVar1 != 0xffffffff);
LAB_00111a49:
      auVar15._0_8_ = (double)iVar8;
      lVar4 = (long)(int)((uVar2 - local_64) + 1);
      auVar18._0_8_ = (double)(long)(((ulong)(lVar4 * lVar4) >> 2) + local_60);
      auVar18._8_8_ = in_XMM3_Qb;
      auVar15._8_8_ = auVar15._0_8_;
      auVar20._8_8_ = 0;
      auVar20._0_8_ = dVar13;
      auVar19 = vunpcklpd_avx(auVar20,auVar18);
      auVar19 = vdivpd_avx(auVar19,auVar15);
      dVar13 = (double)vmovlpd_avx(auVar19);
      this->expected_avg_exp_search_iterations_ = dVar13;
    }
    auVar14 = vshufpd_avx(auVar19,auVar19,1);
    dVar13 = (double)vmovhpd_avx(auVar19);
    this->expected_avg_shifts_ = dVar13;
    auVar16._8_8_ = 0;
    auVar16._0_8_ = auVar14._0_8_ * 0.5 * frac_inserts;
    auVar19 = vfmadd231sd_fma(auVar16,auVar19,ZEXT816(0x4034000000000000));
    dVar13 = auVar19._0_8_;
  }
  return dVar13;
}

Assistant:

double compute_expected_cost(double frac_inserts = 0) {
    if (num_keys_ == 0) {
      return 0;
    }

    ExpectedSearchIterationsAccumulator search_iters_accumulator;
    ExpectedShiftsAccumulator shifts_accumulator(data_capacity_);
    const_iterator_type it(this, 0);
    for (; !it.is_end(); it++) {
      int predicted_position = std::max(
          0, std::min(data_capacity_ - 1, this->model_.predict(it.key())));
      search_iters_accumulator.accumulate(it.cur_idx_, predicted_position);
      shifts_accumulator.accumulate(it.cur_idx_, predicted_position);
    }
    expected_avg_exp_search_iterations_ = search_iters_accumulator.get_stat();
    expected_avg_shifts_ = shifts_accumulator.get_stat();
    double cost =
        kExpSearchIterationsWeight * expected_avg_exp_search_iterations_ +
        kShiftsWeight * expected_avg_shifts_ * frac_inserts;
    return cost;
  }